

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.H
# Opt level: O0

void __thiscall
amrex::AmrMesh::SetBlockingFactor(AmrMesh *this,Vector<int,_std::allocator<int>_> *new_bf)

{
  int *piVar1;
  IntVect *pIVar2;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *in_RSI;
  long in_RDI;
  int i;
  size_type in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int local_20 [2];
  int in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int iVar3;
  
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::resize
            (in_RSI,CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  for (iVar3 = 0; iVar3 <= *(int *)(in_RDI + 0xc); iVar3 = iVar3 + 1) {
    piVar1 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)
                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffffd0 = *piVar1;
    piVar1 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)
                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffffd4 = *piVar1;
    piVar1 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)
                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffc8);
    IntVect::IntVect((IntVect *)local_20,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd4,*piVar1
                    );
    pIVar2 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                       ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffc8);
    *(int (*) [2])pIVar2->vect = local_20;
    pIVar2->vect[2] = in_stack_ffffffffffffffe8;
  }
  return;
}

Assistant:

void SetBlockingFactor (const Vector<int>& new_bf) noexcept {
        blocking_factor.resize(max_level+1);
        for (int i = 0; i <= max_level; ++i) {
            blocking_factor[i] = IntVect{AMREX_D_DECL(new_bf[i],new_bf[i],new_bf[i])};
        }
    }